

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void console_uniforms(bool _show)

{
  bool bVar1;
  undefined3 in_register_00000039;
  int signal;
  
  signal = CONCAT31(in_register_00000039,_show);
  bVar1 = console_is_init();
  if (bVar1) {
    stt_visible = _show;
    console_sigwinch_handler(signal);
    return;
  }
  return;
}

Assistant:

void console_uniforms( bool _show ) {
    #if defined(SUPPORT_NCURSES)
    if (!console_is_init())
        return;

    stt_visible = _show;
    console_sigwinch_handler(0);

    #endif
}